

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutSeq.c
# Opt level: O1

void Cut_NodeComputeCutsSeq
               (Cut_Man_t *p,int Node,int Node0,int Node1,int fCompl0,int fCompl1,int nLat0,
               int nLat1,int fTriv,int CutSetNum)

{
  int iVar1;
  Cut_Cut_t *pTemp;
  Cut_Cut_t *pCVar2;
  Cut_Cut_t **ppCVar3;
  Cut_Cut_t *pCVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long local_118;
  Cut_Cut_t *pHead;
  long local_108;
  Cut_List_t Super;
  
  pCVar2 = Cut_NodeReadCutsOld(p,Node);
  iVar1 = Cut_CutCountList(pCVar2);
  p->nNodeCuts = iVar1;
  if (iVar1 < p->pParams->nKeepMax) {
    if (iVar1 == 0) {
      p->nNodes = p->nNodes + 1;
    }
    pCVar2 = Cut_NodeReadCutsOld(p,Node0);
    p->pStore0[0] = pCVar2;
    pCVar2 = Cut_NodeReadCutsNew(p,Node0);
    p->pStore0[1] = pCVar2;
    pCVar2 = Cut_NodeReadCutsOld(p,Node1);
    p->pStore1[0] = pCVar2;
    pCVar2 = Cut_NodeReadCutsNew(p,Node1);
    p->pStore1[1] = pCVar2;
    if (Node0 == Node1 || (Node == Node1 || Node == Node0)) {
      pCVar2 = Cut_CutDupList(p,p->pStore0[0]);
      p->pStore0[0] = pCVar2;
      pCVar2 = Cut_CutDupList(p,p->pStore0[1]);
      p->pStore0[1] = pCVar2;
      pCVar2 = Cut_CutDupList(p,p->pStore1[0]);
      p->pStore1[0] = pCVar2;
      pCVar2 = Cut_CutDupList(p,p->pStore1[1]);
      p->pStore1[1] = pCVar2;
    }
    if (nLat0 != 0) {
      for (pCVar2 = p->pStore0[0]; pCVar2 != (Cut_Cut_t *)0x0; pCVar2 = pCVar2->pNext) {
        pCVar2->uSign = 0;
        if (0xfffffff < *(uint *)pCVar2) {
          uVar5 = 0;
          uVar6 = 0;
          do {
            uVar8 = *(uint *)((long)&pCVar2[1].field_0x0 + uVar5 * 4) + nLat0;
            *(uint *)((long)&pCVar2[1].field_0x0 + uVar5 * 4) = uVar8;
            uVar6 = uVar6 | 1 << ((int)uVar8 % 0x1f & 0x1fU);
            uVar5 = uVar5 + 1;
          } while (uVar5 < *(uint *)pCVar2 >> 0x1c);
          pCVar2->uSign = uVar6;
        }
      }
      for (pCVar2 = p->pStore0[1]; pCVar2 != (Cut_Cut_t *)0x0; pCVar2 = pCVar2->pNext) {
        pCVar2->uSign = 0;
        if (0xfffffff < *(uint *)pCVar2) {
          uVar5 = 0;
          uVar6 = 0;
          do {
            uVar8 = *(uint *)((long)&pCVar2[1].field_0x0 + uVar5 * 4) + nLat0;
            *(uint *)((long)&pCVar2[1].field_0x0 + uVar5 * 4) = uVar8;
            uVar6 = uVar6 | 1 << ((int)uVar8 % 0x1f & 0x1fU);
            uVar5 = uVar5 + 1;
          } while (uVar5 < *(uint *)pCVar2 >> 0x1c);
          pCVar2->uSign = uVar6;
        }
      }
    }
    if (nLat1 != 0) {
      for (pCVar2 = p->pStore1[0]; pCVar2 != (Cut_Cut_t *)0x0; pCVar2 = pCVar2->pNext) {
        pCVar2->uSign = 0;
        if (0xfffffff < *(uint *)pCVar2) {
          uVar5 = 0;
          uVar6 = 0;
          do {
            uVar8 = *(uint *)((long)&pCVar2[1].field_0x0 + uVar5 * 4) + nLat1;
            *(uint *)((long)&pCVar2[1].field_0x0 + uVar5 * 4) = uVar8;
            uVar6 = uVar6 | 1 << ((int)uVar8 % 0x1f & 0x1fU);
            uVar5 = uVar5 + 1;
          } while (uVar5 < *(uint *)pCVar2 >> 0x1c);
          pCVar2->uSign = uVar6;
        }
      }
      for (pCVar2 = p->pStore1[1]; pCVar2 != (Cut_Cut_t *)0x0; pCVar2 = pCVar2->pNext) {
        pCVar2->uSign = 0;
        if (0xfffffff < *(uint *)pCVar2) {
          uVar5 = 0;
          uVar6 = 0;
          do {
            uVar8 = *(uint *)((long)&pCVar2[1].field_0x0 + uVar5 * 4) + nLat1;
            *(uint *)((long)&pCVar2[1].field_0x0 + uVar5 * 4) = uVar8;
            uVar6 = uVar6 | 1 << ((int)uVar8 % 0x1f & 0x1fU);
            uVar5 = uVar5 + 1;
          } while (uVar5 < *(uint *)pCVar2 >> 0x1c);
          pCVar2->uSign = uVar6;
        }
      }
    }
    pCVar2 = Cut_NodeReadCutsOld(p,Node);
    p->pCompareOld = pCVar2;
    pCVar2 = Cut_NodeReadCutsNew(p,Node);
    p->pCompareNew = pCVar2;
    iVar1 = clock_gettime(3,(timespec *)&Super);
    if (iVar1 < 0) {
      local_118 = 1;
    }
    else {
      lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)Super.pHead[1]),8);
      local_118 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + (long)Super.pHead[0] * -1000000;
    }
    Super.pHead[1] = (Cut_Cut_t *)0x0;
    Super.pHead[2] = (Cut_Cut_t *)0x0;
    Super.pHead[3] = (Cut_Cut_t *)0x0;
    Super.pHead[4] = (Cut_Cut_t *)0x0;
    Super.pHead[5] = (Cut_Cut_t *)0x0;
    Super.pHead[6] = (Cut_Cut_t *)0x0;
    Super.pHead[7] = (Cut_Cut_t *)0x0;
    Super.pHead[8] = (Cut_Cut_t *)0x0;
    Super.pHead[9] = (Cut_Cut_t *)0x0;
    Super.pHead[10] = (Cut_Cut_t *)0x0;
    Super.pHead[0xb] = (Cut_Cut_t *)0x0;
    Super.pHead[0xc] = (Cut_Cut_t *)0x0;
    lVar7 = 8;
    do {
      *(long *)((long)Super.ppTail + lVar7) = (long)Super.pHead + lVar7;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x68);
    Cut_NodeDoComputeCuts(p,&Super,Node,fCompl0,fCompl1,p->pStore0[0],p->pStore1[1],0,0);
    Cut_NodeDoComputeCuts(p,&Super,Node,fCompl0,fCompl1,p->pStore0[1],p->pStore1[0],0,0);
    Cut_NodeDoComputeCuts(p,&Super,Node,fCompl0,fCompl1,p->pStore0[1],p->pStore1[1],fTriv,0);
    ppCVar3 = &pHead;
    pHead = (Cut_Cut_t *)0x0;
    lVar7 = -0x60;
    do {
      pCVar2 = *(Cut_Cut_t **)((long)Super.ppTail + lVar7);
      if (pCVar2 != (Cut_Cut_t *)0x0) {
        *ppCVar3 = pCVar2;
        ppCVar3 = *(Cut_Cut_t ***)(&stack0xffffffffffffffd0 + lVar7);
      }
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0);
    *ppCVar3 = (Cut_Cut_t *)0x0;
    pCVar2 = pHead;
    iVar1 = clock_gettime(3,(timespec *)&pHead);
    if (iVar1 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_108 / 1000 + (long)pHead * 1000000;
    }
    p->timeMerge = p->timeMerge + lVar7 + local_118;
    if (Node0 == Node1 || (Node == Node1 || Node == Node0)) {
      Cut_CutRecycleList(p,p->pStore0[0]);
      Cut_CutRecycleList(p,p->pStore0[1]);
      Cut_CutRecycleList(p,p->pStore1[0]);
      Cut_CutRecycleList(p,p->pStore1[1]);
    }
    else {
      if (nLat0 != 0) {
        for (pCVar4 = p->pStore0[0]; pCVar4 != (Cut_Cut_t *)0x0; pCVar4 = pCVar4->pNext) {
          pCVar4->uSign = 0;
          if (0xfffffff < *(uint *)pCVar4) {
            uVar5 = 0;
            uVar6 = 0;
            do {
              uVar8 = *(uint *)((long)&pCVar4[1].field_0x0 + uVar5 * 4) - nLat0;
              *(uint *)((long)&pCVar4[1].field_0x0 + uVar5 * 4) = uVar8;
              uVar6 = uVar6 | 1 << ((int)uVar8 % 0x1f & 0x1fU);
              uVar5 = uVar5 + 1;
            } while (uVar5 < *(uint *)pCVar4 >> 0x1c);
            pCVar4->uSign = uVar6;
          }
        }
        for (pCVar4 = p->pStore0[1]; pCVar4 != (Cut_Cut_t *)0x0; pCVar4 = pCVar4->pNext) {
          pCVar4->uSign = 0;
          if (0xfffffff < *(uint *)pCVar4) {
            uVar5 = 0;
            uVar6 = 0;
            do {
              uVar8 = *(uint *)((long)&pCVar4[1].field_0x0 + uVar5 * 4) - nLat0;
              *(uint *)((long)&pCVar4[1].field_0x0 + uVar5 * 4) = uVar8;
              uVar6 = uVar6 | 1 << ((int)uVar8 % 0x1f & 0x1fU);
              uVar5 = uVar5 + 1;
            } while (uVar5 < *(uint *)pCVar4 >> 0x1c);
            pCVar4->uSign = uVar6;
          }
        }
      }
      if (nLat1 != 0) {
        for (pCVar4 = p->pStore1[0]; pCVar4 != (Cut_Cut_t *)0x0; pCVar4 = pCVar4->pNext) {
          pCVar4->uSign = 0;
          if (0xfffffff < *(uint *)pCVar4) {
            uVar5 = 0;
            uVar6 = 0;
            do {
              uVar8 = *(uint *)((long)&pCVar4[1].field_0x0 + uVar5 * 4) - nLat1;
              *(uint *)((long)&pCVar4[1].field_0x0 + uVar5 * 4) = uVar8;
              uVar6 = uVar6 | 1 << ((int)uVar8 % 0x1f & 0x1fU);
              uVar5 = uVar5 + 1;
            } while (uVar5 < *(uint *)pCVar4 >> 0x1c);
            pCVar4->uSign = uVar6;
          }
        }
        for (pCVar4 = p->pStore1[1]; pCVar4 != (Cut_Cut_t *)0x0; pCVar4 = pCVar4->pNext) {
          pCVar4->uSign = 0;
          if (0xfffffff < *(uint *)pCVar4) {
            uVar5 = 0;
            uVar6 = 0;
            do {
              uVar8 = *(uint *)((long)&pCVar4[1].field_0x0 + uVar5 * 4) - nLat1;
              *(uint *)((long)&pCVar4[1].field_0x0 + uVar5 * 4) = uVar8;
              uVar6 = uVar6 | 1 << ((int)uVar8 % 0x1f & 0x1fU);
              uVar5 = uVar5 + 1;
            } while (uVar5 < *(uint *)pCVar4 >> 0x1c);
            pCVar4->uSign = uVar6;
          }
        }
      }
    }
    if (CutSetNum < 0) {
      pCVar4 = Cut_NodeReadCutsNew(p,Node);
      if (pCVar4 != (Cut_Cut_t *)0x0) {
        __assert_fail("Cut_NodeReadCutsNew(p, Node) == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutSeq.c"
                      ,0x91,
                      "void Cut_NodeComputeCutsSeq(Cut_Man_t *, int, int, int, int, int, int, int, int, int)"
                     );
      }
      Cut_NodeWriteCutsNew(p,Node,pCVar2);
    }
    else {
      pCVar4 = Cut_NodeReadCutsTemp(p,CutSetNum);
      if (pCVar4 != (Cut_Cut_t *)0x0) {
        __assert_fail("Cut_NodeReadCutsTemp(p, CutSetNum) == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutSeq.c"
                      ,0x8c,
                      "void Cut_NodeComputeCutsSeq(Cut_Man_t *, int, int, int, int, int, int, int, int, int)"
                     );
      }
      Cut_NodeWriteCutsTemp(p,CutSetNum,pCVar2);
    }
    if (p->pParams->nKeepMax <= p->nNodeCuts) {
      p->nCutsLimit = p->nCutsLimit + 1;
    }
  }
  return;
}

Assistant:

void Cut_NodeComputeCutsSeq( Cut_Man_t * p, int Node, int Node0, int Node1, int fCompl0, int fCompl1, int nLat0, int nLat1, int fTriv, int CutSetNum )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pListNew;
    abctime clk;
    
    // get the number of cuts at the node
    p->nNodeCuts = Cut_CutCountList( Cut_NodeReadCutsOld(p, Node) );
    if ( p->nNodeCuts >= p->pParams->nKeepMax )
        return;

    // count only the first visit
    if ( p->nNodeCuts == 0 )
        p->nNodes++;

    // store the fanin lists
    p->pStore0[0] = Cut_NodeReadCutsOld( p, Node0 );
    p->pStore0[1] = Cut_NodeReadCutsNew( p, Node0 );
    p->pStore1[0] = Cut_NodeReadCutsOld( p, Node1 );
    p->pStore1[1] = Cut_NodeReadCutsNew( p, Node1 );

    // duplicate the cut lists if fanin nodes are non-standard
    if ( Node == Node0 || Node == Node1 || Node0 == Node1 )
    {
        p->pStore0[0] = Cut_CutDupList( p, p->pStore0[0] );
        p->pStore0[1] = Cut_CutDupList( p, p->pStore0[1] );
        p->pStore1[0] = Cut_CutDupList( p, p->pStore1[0] );
        p->pStore1[1] = Cut_CutDupList( p, p->pStore1[1] );
    }

    // shift the cuts by as many latches and recompute signatures
    if ( nLat0 ) Cut_NodeShiftCutLeaves( p->pStore0[0], nLat0 );
    if ( nLat0 ) Cut_NodeShiftCutLeaves( p->pStore0[1], nLat0 );
    if ( nLat1 ) Cut_NodeShiftCutLeaves( p->pStore1[0], nLat1 );
    if ( nLat1 ) Cut_NodeShiftCutLeaves( p->pStore1[1], nLat1 );

    // store the original lists for comparison
    p->pCompareOld = Cut_NodeReadCutsOld( p, Node );
    p->pCompareNew = Cut_NodeReadCutsNew( p, Node );

    // merge the old and the new
clk = Abc_Clock();
    Cut_ListStart( pSuper );
    Cut_NodeDoComputeCuts( p, pSuper, Node, fCompl0, fCompl1, p->pStore0[0], p->pStore1[1], 0, 0 );
    Cut_NodeDoComputeCuts( p, pSuper, Node, fCompl0, fCompl1, p->pStore0[1], p->pStore1[0], 0, 0 );
    Cut_NodeDoComputeCuts( p, pSuper, Node, fCompl0, fCompl1, p->pStore0[1], p->pStore1[1], fTriv, 0 );
    pListNew = Cut_ListFinish( pSuper );
p->timeMerge += Abc_Clock() - clk;

    // shift the cuts by as many latches and recompute signatures
    if ( Node == Node0 || Node == Node1 || Node0 == Node1 )
    {
        Cut_CutRecycleList( p, p->pStore0[0] );
        Cut_CutRecycleList( p, p->pStore0[1] );
        Cut_CutRecycleList( p, p->pStore1[0] );
        Cut_CutRecycleList( p, p->pStore1[1] );
    }
    else
    {
        if ( nLat0 ) Cut_NodeShiftCutLeaves( p->pStore0[0], -nLat0 );
        if ( nLat0 ) Cut_NodeShiftCutLeaves( p->pStore0[1], -nLat0 );
        if ( nLat1 ) Cut_NodeShiftCutLeaves( p->pStore1[0], -nLat1 );
        if ( nLat1 ) Cut_NodeShiftCutLeaves( p->pStore1[1], -nLat1 );
    }

    // set the lists at the node
    if ( CutSetNum >= 0 )
    {
        assert( Cut_NodeReadCutsTemp(p, CutSetNum) == NULL );
        Cut_NodeWriteCutsTemp( p, CutSetNum, pListNew );
    }
    else
    {
        assert( Cut_NodeReadCutsNew(p, Node) == NULL );
        Cut_NodeWriteCutsNew( p, Node, pListNew );
    }

    // mark the node if we exceeded the number of cuts
    if ( p->nNodeCuts >= p->pParams->nKeepMax )
        p->nCutsLimit++;
}